

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

int gdTransformAffineCopy
              (gdImagePtr dst,int dst_x,int dst_y,gdImagePtr src,gdRectPtr src_region,double *affine
              )

{
  int iVar1;
  int iVar2;
  gdImagePtr im;
  int iVar3;
  int iVar4;
  int y_00;
  int color;
  int iVar5;
  gdInterpolationMethod local_ec;
  gdInterpolationMethod interpolation_id_bak;
  int end_y;
  int end_x;
  gdRect bbox;
  gdPointF src_pt;
  gdPointF pt;
  int *dst_p;
  double inv [6];
  int src_offset_y;
  int src_offset_x;
  int y;
  int x;
  int backup_clipy2;
  int backup_clipx2;
  int backup_clipy1;
  int backup_clipx1;
  int backclip;
  int c2y;
  int c2x;
  int c1y;
  int c1x;
  double *affine_local;
  gdRectPtr src_region_local;
  gdImagePtr src_local;
  int dst_y_local;
  int dst_x_local;
  gdImagePtr dst_local;
  
  backup_clipy1 = 0;
  local_ec = GD_DEFAULT;
  _c1y = affine;
  affine_local = (double *)src_region;
  src_region_local = (gdRectPtr)src;
  src_local._0_4_ = dst_y;
  src_local._4_4_ = dst_x;
  _dst_y_local = dst;
  if (((src->interpolation_id == GD_BILINEAR_FIXED) || (src->interpolation_id == GD_BICUBIC_FIXED))
     || (src->interpolation_id == GD_NEAREST_NEIGHBOUR)) {
    local_ec = src->interpolation_id;
    gdImageSetInterpolationMethod(src,GD_BICUBIC);
  }
  gdImageClipRectangle((gdImagePtr)src_region_local,(gdRectPtr)affine_local);
  if (((0 < *(int *)affine_local) || (0 < *(int *)((long)affine_local + 4))) ||
     ((*(int *)(affine_local + 1) < src_region_local->width ||
      (*(int *)((long)affine_local + 0xc) < src_region_local->height)))) {
    backup_clipy1 = 1;
    gdImageGetClip((gdImagePtr)src_region_local,&backup_clipx2,&backup_clipy2,&x,&y);
    gdImageSetClip((gdImagePtr)src_region_local,*(int *)affine_local,
                   *(int *)((long)affine_local + 4),
                   *(int *)affine_local + *(int *)(affine_local + 1) + -1,
                   *(int *)((long)affine_local + 4) + *(int *)((long)affine_local + 0xc) + -1);
  }
  iVar3 = gdTransformAffineBoundingBox((gdRectPtr)affine_local,_c1y,(gdRectPtr)&end_y);
  if (iVar3 == 0) {
    if (backup_clipy1 != 0) {
      gdImageSetClip((gdImagePtr)src_region_local,backup_clipx2,backup_clipy2,x,y);
    }
    gdImageSetInterpolationMethod((gdImagePtr)src_region_local,local_ec);
    dst_local._4_4_ = 0;
  }
  else {
    gdImageGetClip(_dst_y_local,&c2x,&c2y,&backclip,&backup_clipx1);
    iVar3 = end_y;
    if (end_y < 1) {
      iVar3 = -end_y;
    }
    iVar5 = end_x;
    if (end_x < 1) {
      iVar5 = -end_x;
    }
    gdAffineInvert((double *)&dst_p,_c1y);
    iVar1 = *(int *)affine_local;
    iVar2 = *(int *)((long)affine_local + 4);
    if (_dst_y_local->alphaBlendingFlag == 0) {
      for (src_offset_y = 0; src_offset_y <= bbox.y + iVar5; src_offset_y = src_offset_y + 1) {
        if ((-1 < (int)src_local + src_offset_y) &&
           ((int)src_local + src_offset_y <= _dst_y_local->sy + -1)) {
          pt.y = (double)(_dst_y_local->tpixels[(int)src_local + src_offset_y] + src_local._4_4_);
          for (src_offset_x = 0; src_offset_x <= bbox.x + iVar3; src_offset_x = src_offset_x + 1) {
            src_pt.y = (double)src_offset_x + 0.5 + (double)end_y;
            gdAffineApplyToPointF((gdPointFPtr)&bbox.width,(gdPointFPtr)&src_pt.y,(double *)&dst_p);
            if ((src_local._4_4_ + src_offset_x < 0) ||
               (_dst_y_local->sx + -1 < src_local._4_4_ + src_offset_x)) break;
            iVar4 = getPixelInterpolated
                              ((gdImagePtr)src_region_local,(double)iVar1 + (double)bbox._8_8_,
                               (double)iVar2 + src_pt.x,-1);
            *(int *)pt.y = iVar4;
            pt.y = (double)((long)pt.y + 4);
          }
        }
      }
    }
    else {
      for (src_offset_y = end_x; src_offset_y <= bbox.y + iVar5; src_offset_y = src_offset_y + 1) {
        for (src_offset_x = 0; src_offset_x <= bbox.x + iVar3; src_offset_x = src_offset_x + 1) {
          src_pt.y = (double)src_offset_x + 0.5;
          gdAffineApplyToPointF((gdPointFPtr)&bbox.width,(gdPointFPtr)&src_pt.y,(double *)&dst_p);
          im = _dst_y_local;
          iVar4 = src_local._4_4_ + src_offset_x;
          y_00 = (int)src_local + src_offset_y;
          color = getPixelInterpolated
                            ((gdImagePtr)src_region_local,(double)iVar1 + (double)bbox._8_8_,
                             (double)iVar2 + src_pt.x,0);
          gdImageSetPixel(im,iVar4,y_00,color);
        }
      }
    }
    if (backup_clipy1 != 0) {
      gdImageSetClip((gdImagePtr)src_region_local,backup_clipx2,backup_clipy2,x,y);
    }
    gdImageSetInterpolationMethod((gdImagePtr)src_region_local,local_ec);
    dst_local._4_4_ = 1;
  }
  return dst_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdTransformAffineCopy(gdImagePtr dst,
		  int dst_x, int dst_y,
		  const gdImagePtr src,
		  gdRectPtr src_region,
		  const double affine[6])
{
	int c1x,c1y,c2x,c2y;
	int backclip = 0;
	int backup_clipx1, backup_clipy1, backup_clipx2, backup_clipy2;
	register int x, y, src_offset_x, src_offset_y;
	double inv[6];
	int *dst_p;
	gdPointF pt, src_pt;
	gdRect bbox;
	int end_x, end_y;
	gdInterpolationMethod interpolation_id_bak = GD_DEFAULT;

	/* These methods use special implementations */
	if (src->interpolation_id == GD_BILINEAR_FIXED || src->interpolation_id == GD_BICUBIC_FIXED || src->interpolation_id == GD_NEAREST_NEIGHBOUR) {
		interpolation_id_bak = src->interpolation_id;
		
		gdImageSetInterpolationMethod(src, GD_BICUBIC);
	}


	gdImageClipRectangle(src, src_region);

	if (src_region->x > 0 || src_region->y > 0
		|| src_region->width < gdImageSX(src)
		|| src_region->height < gdImageSY(src)) {
		backclip = 1;

		gdImageGetClip(src, &backup_clipx1, &backup_clipy1,
		&backup_clipx2, &backup_clipy2);

		gdImageSetClip(src, src_region->x, src_region->y,
			src_region->x + src_region->width - 1,
			src_region->y + src_region->height - 1);
	}

	if (!gdTransformAffineBoundingBox(src_region, affine, &bbox)) {
		if (backclip) {
			gdImageSetClip(src, backup_clipx1, backup_clipy1,
					backup_clipx2, backup_clipy2);
		}
		gdImageSetInterpolationMethod(src, interpolation_id_bak);
		return GD_FALSE;
	}

	gdImageGetClip(dst, &c1x, &c1y, &c2x, &c2y);

	end_x = bbox.width  + abs(bbox.x);
	end_y = bbox.height + abs(bbox.y);

	/* Get inverse affine to let us work with destination -> source */
	gdAffineInvert(inv, affine);

	src_offset_x =  src_region->x;
	src_offset_y =  src_region->y;

	if (dst->alphaBlendingFlag) {
		for (y = bbox.y; y <= end_y; y++) {
			pt.y = y + 0.5;
			for (x = 0; x <= end_x; x++) {
				pt.x = x + 0.5;
				gdAffineApplyToPointF(&src_pt, &pt, inv);
				gdImageSetPixel(dst, dst_x + x, dst_y + y, getPixelInterpolated(src, src_offset_x + src_pt.x, src_offset_y + src_pt.y, 0));
			}
		}
	} else {
		for (y = 0; y <= end_y; y++) {
			pt.y = y + 0.5 + bbox.y;
			if ((dst_y + y) < 0 || ((dst_y + y) > gdImageSY(dst) -1)) {
				continue;
			}
			dst_p = dst->tpixels[dst_y + y] + dst_x;

			for (x = 0; x <= end_x; x++) {
				pt.x = x + 0.5 + bbox.x;
				gdAffineApplyToPointF(&src_pt, &pt, inv);

				if ((dst_x + x) < 0 || (dst_x + x) > (gdImageSX(dst) - 1)) {
					break;
				}
				*(dst_p++) = getPixelInterpolated(src, src_offset_x + src_pt.x, src_offset_y + src_pt.y, -1);
			}
		}
	}

	/* Restore clip if required */
	if (backclip) {
		gdImageSetClip(src, backup_clipx1, backup_clipy1,
				backup_clipx2, backup_clipy2);
	}

	gdImageSetInterpolationMethod(src, interpolation_id_bak);
	return GD_TRUE;
}